

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  float local_38;
  int local_34;
  float local_30;
  int i;
  float w_item_last;
  float w_item_one;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float w_full_local;
  int components_local;
  
  window = (ImGuiWindow *)GImGui;
  style = (ImGuiStyle *)GImGui->CurrentWindow;
  _w_item_last = &GImGui->Style;
  g._0_4_ = w_full;
  g._4_4_ = components;
  i = (int)ImMax<float>(1.0,(float)(int)((-(GImGui->Style).ItemInnerSpacing.x *
                                          (float)(components + -1) + w_full) / (float)components));
  local_30 = ImMax<float>(1.0,(float)(int)(-((float)i + (_w_item_last->ItemInnerSpacing).x) *
                                           (float)(g._4_4_ + -1) + g._0_4_));
  ImVector<float>::push_back((ImVector<float> *)&style->Colors[0xd].z,&style->Colors[0xc].w);
  ImVector<float>::push_back((ImVector<float> *)&style->Colors[0xd].z,&local_30);
  for (local_34 = 0; local_34 < g._4_4_ + -2; local_34 = local_34 + 1) {
    ImVector<float>::push_back((ImVector<float> *)&style->Colors[0xd].z,(float *)&i);
  }
  if (g._4_4_ == 1) {
    local_38 = local_30;
  }
  else {
    local_38 = (float)i;
  }
  style->Colors[0xc].w = local_38;
  window[0x11].ContentSize.y = (float)((uint)window[0x11].ContentSize.y & 0xfffffffe);
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}